

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteratedhash.hpp
# Opt level: O0

void __thiscall
crypto::iterated_hash<crypto::sha1_transform>::update
          (iterated_hash<crypto::sha1_transform> *this,char *data,size_t length)

{
  uint uVar1;
  unsigned_long uVar2;
  size_t sVar3;
  size_t in_RDX;
  void *in_RSI;
  void *in_RDI;
  size_t unaff_retaddr;
  char *in_stack_00000008;
  size_t left_over;
  size_t num;
  hash_word old_count_lo;
  unsigned_long local_30;
  unsigned_long local_28;
  uint local_1c;
  size_t local_18;
  void *local_10;
  
  local_1c = *(uint *)((long)in_RDI + 0x54);
  uVar1 = local_1c + (int)in_RDX;
  *(uint *)((long)in_RDI + 0x54) = uVar1;
  if (uVar1 < local_1c) {
    *(int *)((long)in_RDI + 0x58) = *(int *)((long)in_RDI + 0x58) + 1;
  }
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar2 = util::safe_right_shift<32u,unsigned_long>(0x160770);
  *(int *)((long)in_RDI + 0x58) = (int)uVar2 + *(int *)((long)in_RDI + 0x58);
  local_30 = 0x40;
  local_28 = util::mod_power_of_2<unsigned_int,unsigned_long>(&local_1c,&local_30);
  if (local_28 != 0) {
    if (local_28 + local_18 < 0x40) {
      memcpy((void *)((long)in_RDI + local_28),local_10,local_18);
      return;
    }
    memcpy((void *)((long)in_RDI + local_28),local_10,0x40 - local_28);
    hash((hash_word *)left_over,in_stack_00000008,unaff_retaddr);
    local_10 = (void *)((0x40 - local_28) + (long)local_10);
    local_18 = local_18 - (0x40 - local_28);
  }
  if (0x3f < local_18) {
    sVar3 = hash((hash_word *)left_over,in_stack_00000008,unaff_retaddr);
    local_10 = (void *)((local_18 - sVar3) + (long)local_10);
    local_18 = sVar3;
  }
  if (local_18 != 0) {
    memcpy(in_RDI,local_10,local_18);
  }
  return;
}

Assistant:

void iterated_hash<T>::update(const char * data, size_t length) {
	
	hash_word old_count_lo = count_lo;
	
	if((count_lo = old_count_lo + hash_word(length)) < old_count_lo) {
		count_hi++; // carry from low to high
	}
	
	count_hi += hash_word(util::safe_right_shift<8 * sizeof(hash_word)>(length));
	
	size_t num = util::mod_power_of_2(old_count_lo, size_t(block_size));
	
	if(num != 0) { // process left over data
		if(num + length >= block_size) {
			std::memcpy(buffer + num, data, block_size - num);
			hash(state, buffer, block_size);
			data += (block_size - num);
			length -= (block_size - num);
			// drop through and do the rest
		} else {
			std::memcpy(buffer + num, data, length);
			return;
		}
	}
	
	// now process the input data in blocks of BlockSize bytes and save the leftovers to m_data
	if(length >= block_size) {
		size_t left_over = hash(state, data, length);
		data += (length - left_over);
		length = left_over;
	}
	
	if(length) {
		memcpy(buffer, data, length);
	}
}